

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_predictive_encoder.h
# Opt level: O2

void __thiscall
draco::MeshEdgebreakerTraversalPredictiveEncoder::Done
          (MeshEdgebreakerTraversalPredictiveEncoder *this)

{
  EncoderBuffer *this_00;
  ulong __n;
  reference rVar1;
  BinaryEncoder prediction_encoder;
  RAnsBitEncoder RStack_58;
  
  if (this->prev_symbol_ != ~TOPOLOGY_C) {
    MeshEdgebreakerTraversalEncoder::EncodeSymbol
              (&this->super_MeshEdgebreakerTraversalEncoder,this->prev_symbol_);
  }
  MeshEdgebreakerTraversalEncoder::Done(&this->super_MeshEdgebreakerTraversalEncoder);
  this_00 = &(this->super_MeshEdgebreakerTraversalEncoder).traversal_buffer_;
  EncoderBuffer::Encode<int>(this_00,&this->num_split_symbols_);
  RAnsBitEncoder::RAnsBitEncoder(&RStack_58);
  RAnsBitEncoder::StartEncoding(&RStack_58);
  __n = (ulong)((*(int *)&(this->predictions_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                *(int *)&(this->predictions_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
               (this->predictions_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
  while (0 < (int)__n) {
    __n = __n - 1;
    rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->predictions_,__n);
    RAnsBitEncoder::EncodeBit(&RStack_58,(*rVar1._M_p & rVar1._M_mask) != 0);
  }
  RAnsBitEncoder::EndEncoding(&RStack_58,this_00);
  RAnsBitEncoder::~RAnsBitEncoder(&RStack_58);
  return;
}

Assistant:

void Done() {
    // We still need to store the last encoded symbol.
    if (prev_symbol_ != -1) {
      MeshEdgebreakerTraversalEncoder::EncodeSymbol(
          static_cast<EdgebreakerTopologyBitPattern>(prev_symbol_));
    }
    // Store the init face configurations and the explicitly encoded symbols.
    MeshEdgebreakerTraversalEncoder::Done();
    // Encode the number of split symbols.
    GetOutputBuffer()->Encode(num_split_symbols_);
    // Store the predictions.
    BinaryEncoder prediction_encoder;
    prediction_encoder.StartEncoding();
    for (int i = static_cast<int>(predictions_.size()) - 1; i >= 0; --i) {
      prediction_encoder.EncodeBit(predictions_[i]);
    }
    prediction_encoder.EndEncoding(GetOutputBuffer());
  }